

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbuildmultiphysicsmesh.cpp
# Opt level: O1

void TPZBuildMultiphysicsMesh::TransferFromMultiPhysicsT<std::complex<double>>
               (TPZVec<TPZCompMesh_*> *cmeshVec,TPZCompMesh *MFMesh)

{
  undefined8 *puVar1;
  uint uVar2;
  long lVar3;
  undefined8 uVar4;
  int64_t iVar5;
  TPZFMatrix<std::complex<double>_> *pTVar6;
  TPZFMatrix<std::complex<double>_> *pTVar7;
  TPZConnect *pTVar8;
  int64_t iVar9;
  TPZCompEl **ppTVar10;
  TPZCompMesh *pTVar11;
  int iVar12;
  int r;
  int64_t nelem;
  long lVar13;
  TPZVec<std::pair<TPZCompMesh_*,_long>_> indexes;
  TPZVec<std::pair<TPZCompMesh_*,_long>_> local_50;
  
  local_50._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01a08a30;
  local_50.fStore = (pair<TPZCompMesh_*,_long> *)0x0;
  local_50.fNElements = 0;
  local_50.fNAlloc = 0;
  ComputeAtomicIndexes(MFMesh,&local_50);
  iVar5 = local_50.fNElements;
  pTVar6 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&MFMesh->fSolution);
  if (0 < iVar5) {
    nelem = 0;
    do {
      pTVar11 = local_50.fStore[nelem].first;
      if (pTVar11 != (TPZCompMesh *)0x0) {
        pTVar7 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar11->fSolution);
        pTVar8 = TPZChunkVector<TPZConnect,_10>::operator[]
                           (&(pTVar11->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,
                            local_50.fStore[nelem].second);
        if (pTVar8->fSequenceNumber < 0) {
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzbuildmultiphysicsmesh.cpp"
                     ,0x1aa);
        }
        iVar12 = (int)pTVar8->fSequenceNumber;
        uVar2 = (pTVar11->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[iVar12].dim;
        pTVar8 = TPZChunkVector<TPZConnect,_10>::operator[]
                           (&(MFMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,nelem);
        lVar3 = pTVar8->fSequenceNumber;
        if (lVar3 < 0) {
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzbuildmultiphysicsmesh.cpp"
                     ,0x1ae);
        }
        if (0 < (int)uVar2) {
          lVar13 = 0;
          r = 0;
          do {
            iVar9 = TPZBlock::Index(&MFMesh->fBlock,lVar3,r);
            uVar4 = *(undefined8 *)(pTVar6->fElem[iVar9]._M_value + 8);
            puVar1 = (undefined8 *)
                     (pTVar7->fElem
                      [(pTVar11->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[iVar12].pos].
                      _M_value + lVar13);
            *puVar1 = *(undefined8 *)pTVar6->fElem[iVar9]._M_value;
            puVar1[1] = uVar4;
            r = r + 1;
            lVar13 = lVar13 + 0x10;
          } while ((ulong)uVar2 << 4 != lVar13);
        }
      }
      nelem = nelem + 1;
    } while (nelem != iVar5);
  }
  lVar3 = (MFMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  if (0 < lVar3) {
    lVar13 = 0;
    do {
      ppTVar10 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                           (&(MFMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,lVar13);
      if (*ppTVar10 == (TPZCompEl *)0x0) {
        pTVar11 = (TPZCompMesh *)0x0;
      }
      else {
        pTVar11 = (TPZCompMesh *)
                  __dynamic_cast(*ppTVar10,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo,0x918);
      }
      if (pTVar11 != (TPZCompMesh *)0x0) {
        TransferFromMultiPhysics(cmeshVec,pTVar11);
      }
      lVar13 = lVar13 + 1;
    } while (lVar3 != lVar13);
  }
  local_50._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01a08a30;
  if (local_50.fStore != (pair<TPZCompMesh_*,_long> *)0x0) {
    operator_delete__(local_50.fStore);
  }
  return;
}

Assistant:

void TPZBuildMultiphysicsMesh::TransferFromMultiPhysicsT(TPZVec<TPZCompMesh *> &cmeshVec, TPZCompMesh *MFMesh)
{
    
    TPZVec<atomic_index> indexes;
    ComputeAtomicIndexes(MFMesh, indexes);
    int64_t nconnect = indexes.size();
    TPZBlock &blockMF = MFMesh->Block();
    TPZFMatrix<TVar> &solMF = MFMesh->Solution();
    for(int64_t connect = 0; connect < nconnect; connect++)
    {
        TPZCompMesh *atomic_mesh = indexes[connect].first;
        //TODOCOMPLEX
        if(!atomic_mesh) continue;
        TPZFMatrix<TVar> &atomic_mesh_sol = atomic_mesh->Solution();
        TPZBlock &block = atomic_mesh->Block();
        int64_t atomicindexconnect = indexes[connect].second;
        TPZConnect &con = atomic_mesh->ConnectVec()[atomicindexconnect];
        int64_t seqnum = con.SequenceNumber();
        if(seqnum<0) DebugStop();       /// Whether connect was deleted by previous refined process
        int blsize = block.Size(seqnum);
        TPZConnect &conMF = MFMesh->ConnectVec()[connect];
        int64_t seqnumMF = conMF.SequenceNumber();
        if(seqnumMF < 0) DebugStop();
        for (int idf=0; idf<blsize; idf++) {
            TVar val = solMF(blockMF.Index(seqnumMF, idf));
            int64_t pos = block.Position(seqnum);
            atomic_mesh_sol(pos+idf) = val;
        }
    }
    
    int64_t nel = MFMesh->NElements();
    for (int64_t el = 0; el<nel; el++) {
        TPZCompEl *cel = MFMesh->Element(el);
        TPZSubCompMesh *sub = dynamic_cast<TPZSubCompMesh *>(cel);
        if(sub)
        {
            TransferFromMultiPhysics(cmeshVec, sub);
        }
    }
}